

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O0

int s2pred::TriageEdgeCircumcenterSign<double>
              (Vector3<double> *x0,Vector3<double> *x1,Vector3<double> *a,Vector3<double> *b,
              Vector3<double> *c,int abc_sign)

{
  double dVar1;
  FloatType FVar2;
  FloatType FVar3;
  __type_conflict _Var4;
  __type_conflict _Var5;
  double dVar6;
  int local_e4;
  double result_error;
  double nx_error;
  double nx_len;
  double z_len;
  double result;
  D local_90;
  undefined1 local_78 [8];
  Vector3<double> nx;
  Vector3<double> z;
  double z_error;
  double T_ERR;
  int abc_sign_local;
  Vector3<double> *c_local;
  Vector3<double> *b_local;
  Vector3<double> *a_local;
  Vector3<double> *x1_local;
  Vector3<double> *x0_local;
  
  GetCircumcenter<double>((Vector3<double> *)(nx.c_ + 2),a,b,c,z.c_ + 2);
  util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator-
            (&local_90,(BasicVector<Vector3,_double,_3UL> *)x0,x1);
  util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator+
            ((D *)&result,(BasicVector<Vector3,_double,_3UL> *)x0,x1);
  Vector3<double>::CrossProd((Vector3<double> *)local_78,&local_90,(Vector3<double> *)&result);
  dVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::DotProd
                    ((BasicVector<Vector3,_double,_3UL> *)local_78,(D *)(nx.c_ + 2));
  FVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm
                    ((BasicVector<Vector3,_double,_3UL> *)(nx.c_ + 2));
  FVar3 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm
                    ((BasicVector<Vector3,_double,_3UL> *)local_78);
  _Var4 = std::sqrt<int>(3);
  _Var5 = std::sqrt<int>(3);
  dVar6 = (FVar3 * 3.3306690738754696e-16 +
          ((_Var4 * 2.0 + 1.0) * FVar3 + _Var5 * 32.0 * 1.1102230246251565e-16) *
          1.1102230246251565e-16) * FVar2 + z.c_[2] * FVar3;
  if ((double)abc_sign * dVar1 <= dVar6) {
    local_e4 = 0;
    if ((double)abc_sign * dVar1 < -dVar6) {
      local_e4 = -1;
    }
  }
  else {
    local_e4 = 1;
  }
  return local_e4;
}

Assistant:

int TriageEdgeCircumcenterSign(const Vector3<T>& x0, const Vector3<T>& x1,
                               const Vector3<T>& a, const Vector3<T>& b,
                               const Vector3<T>& c, int abc_sign) {
  constexpr T T_ERR = rounding_epsilon<T>();

  // Compute the circumcenter Z of triangle ABC, and then test which side of
  // edge X it lies on.
  T z_error;
  Vector3<T> z = GetCircumcenter(a, b, c, &z_error);
  Vector3<T> nx = (x0 - x1).CrossProd(x0 + x1);
  // If the sign of triangle ABC is negative, then we have computed -Z and the
  // result should be negated.
  T result = abc_sign * nx.DotProd(z);

  T z_len = z.Norm();
  T nx_len = nx.Norm();
  T nx_error = ((1 + 2 * sqrt(3)) * nx_len + 32 * sqrt(3) * DBL_ERR) * T_ERR;
  T result_error = ((3 * T_ERR * nx_len + nx_error) * z_len + z_error * nx_len);
  return (result > result_error) ? 1 : (result < -result_error) ? -1 : 0;
}